

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchIf<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  bool bVar1;
  
  bVar1 = matches(this,expected);
  if (bVar1) {
    skip(this);
  }
  return bVar1;
}

Assistant:

bool matchIf (Type expected)                                { if (matches (expected)) { skip(); return true; } return false; }